

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void anon_unknown.dwarf_8fcfa::Dilate
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,uint32_t dilationX
               ,uint32_t dilationY,uint8_t value)

{
  undefined1 *puVar1;
  undefined1 auVar2 [16];
  uint32_t uVar3;
  ulong uVar4;
  void *pvVar5;
  uchar *puVar6;
  byte *pbVar7;
  byte *pbVar8;
  undefined1 *puVar9;
  uint in_ECX;
  int in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  undefined1 in_stack_00000010;
  uint32_t i_1;
  uint32_t rowId;
  uint8_t *imageYEnd_1;
  uint8_t *imageY_1;
  uint8_t *imageYStart;
  uint8_t previousValue_1;
  uint32_t pairCount_1;
  uint8_t *imageXEnd_1;
  uint8_t *imageX_1;
  uint32_t rowSize_1;
  uint8_t **endPos_1;
  uint8_t **startPos_1;
  uint32_t i;
  uint8_t *imageXEnd;
  uint8_t *imageX;
  uint8_t *imageXStart;
  uint8_t previousValue;
  uint32_t pairCount;
  uint8_t *imageYEnd;
  uint8_t *imageY;
  uint32_t rowSize;
  uint8_t **endPos;
  uint8_t **startPos;
  int32_t dilateX;
  uint32_t in_stack_ffffffffffffff40;
  uint uVar10;
  uint32_t in_stack_ffffffffffffff44;
  undefined8 in_stack_ffffffffffffff48;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff50;
  byte local_9d;
  uint local_9c;
  byte *local_90;
  uint local_6c;
  byte *local_60;
  byte local_4d;
  uint local_4c;
  byte *local_40;
  uint local_1c;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff50,(uint32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
            );
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  local_1c = in_R9D;
  if (in_ECX >> 1 < in_R9D) {
    local_1c = in_ECX >> 1;
  }
  if (in_R8D >> 1 < in_stack_00000008) {
    in_stack_00000008 = in_R8D >> 1;
  }
  if (local_1c != 0) {
    auVar2 = ZEXT416(in_ECX << 1) * ZEXT816(8);
    uVar4 = auVar2._0_8_;
    if (auVar2._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar4);
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
    puVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
    local_40 = puVar6 + (ulong)in_ESI + (ulong)(in_EDX * uVar3);
    pbVar7 = local_40 + in_R8D * uVar3;
    for (; local_40 != pbVar7; local_40 = local_40 + uVar3) {
      local_4c = 0;
      local_4d = *local_40;
      pbVar8 = local_40 + in_ECX;
      local_60 = local_40;
      while (local_60 = local_60 + 1, local_60 != pbVar8) {
        if (*local_60 != local_4d) {
          if ((long)local_60 - (long)local_40 < (long)(int)local_1c) {
            *(byte **)((long)pvVar5 + (ulong)local_4c * 8) = local_40;
          }
          else {
            *(long *)((long)pvVar5 + (ulong)local_4c * 8) = (long)local_60 - (long)(int)local_1c;
          }
          if ((long)pbVar8 - (long)local_60 < (long)(int)local_1c) {
            *(byte **)((long)pvVar5 + (ulong)local_4c * 8 + (ulong)in_ECX * 8) = pbVar8;
          }
          else {
            *(byte **)((long)pvVar5 + (ulong)local_4c * 8 + (ulong)in_ECX * 8) =
                 local_60 + (int)local_1c;
          }
          local_4d = local_4d ^ 0xff;
          local_4c = local_4c + 1;
        }
      }
      for (local_6c = 0; local_6c < local_4c; local_6c = local_6c + 1) {
        puVar9 = *(undefined1 **)((long)pvVar5 + (ulong)local_6c * 8 + (ulong)in_ECX * 8);
        for (local_60 = *(byte **)((long)pvVar5 + (ulong)local_6c * 8); local_60 != puVar9;
            local_60 = local_60 + 1) {
          *local_60 = in_stack_00000010;
        }
      }
    }
    if (pvVar5 != (void *)0x0) {
      operator_delete__(pvVar5);
    }
  }
  if (in_stack_00000008 != 0) {
    auVar2 = ZEXT416(in_R8D << 1) * ZEXT816(8);
    uVar4 = auVar2._0_8_;
    if (auVar2._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar4);
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
    puVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
    local_90 = puVar6 + (ulong)in_ESI + (ulong)(in_EDX * uVar3);
    pbVar7 = local_90 + in_ECX;
    for (; local_90 != pbVar7; local_90 = local_90 + 1) {
      local_9c = 0;
      local_9d = *local_90;
      for (pbVar8 = local_90 + uVar3; pbVar8 != local_90 + in_R8D * uVar3; pbVar8 = pbVar8 + uVar3)
      {
        if (*pbVar8 != local_9d) {
          uVar10 = (uint)(((long)pbVar8 - (long)local_90 & 0xffffffffU) / (ulong)uVar3);
          if (uVar10 < in_stack_00000008) {
            *(byte **)((long)pvVar5 + (ulong)local_9c * 8) = local_90;
          }
          else {
            *(ulong *)((long)pvVar5 + (ulong)local_9c * 8) =
                 (long)pbVar8 - (ulong)(in_stack_00000008 * uVar3);
          }
          if (in_R8D - uVar10 < in_stack_00000008) {
            *(byte **)((long)pvVar5 + (ulong)local_9c * 8 + (ulong)in_R8D * 8) =
                 local_90 + in_R8D * uVar3;
          }
          else {
            *(byte **)((long)pvVar5 + (ulong)local_9c * 8 + (ulong)in_R8D * 8) =
                 pbVar8 + in_stack_00000008 * uVar3;
          }
          local_9d = local_9d ^ 0xff;
          local_9c = local_9c + 1;
        }
      }
      for (uVar10 = 0; uVar10 < local_9c; uVar10 = uVar10 + 1) {
        puVar1 = *(undefined1 **)((long)pvVar5 + (ulong)uVar10 * 8 + (ulong)in_R8D * 8);
        for (puVar9 = *(undefined1 **)((long)pvVar5 + (ulong)uVar10 * 8); puVar9 != puVar1;
            puVar9 = puVar9 + uVar3) {
          *puVar9 = in_stack_00000010;
        }
      }
    }
    if (pvVar5 != (void *)0x0) {
      operator_delete__(pvVar5);
    }
  }
  return;
}

Assistant:

void Dilate( PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, uint32_t dilationX, uint32_t dilationY, uint8_t value )
    {
        Image_Function::ParameterValidation( image, x, y, width, height );
        Image_Function::VerifyGrayScaleImage( image );


        if( dilationX > width / 2 )
            dilationX = width / 2;
        if( dilationY > height / 2 )
            dilationY = height / 2;

        if( dilationX > 0u ) {
            const int32_t dilateX = static_cast<int32_t>(dilationX);

            uint8_t ** startPos = new uint8_t *[2 * width];
            uint8_t ** endPos = startPos + width;

            const uint32_t rowSize = image.rowSize();
            uint8_t * imageY    = image.data() + y * rowSize + x;
            uint8_t * imageYEnd = imageY + height * rowSize;

            for( ; imageY != imageYEnd; imageY += rowSize ) {
                uint32_t pairCount = 0u;

                uint8_t previousValue = *imageY;

                uint8_t * imageXStart = imageY;
                uint8_t * imageX      = imageXStart + 1;
                uint8_t * imageXEnd   = imageXStart + width;

                for( ; imageX != imageXEnd; ++imageX ) {
                    if( (*imageX) != previousValue ) {
                        if( imageX - imageXStart < dilateX )
                            startPos[pairCount] = imageXStart;
                        else
                            startPos[pairCount] = imageX - dilateX;

                        if( imageXEnd - imageX < dilateX )
                            endPos[pairCount] = imageXEnd;
                        else
                            endPos[pairCount] = imageX + dilateX;

                        previousValue = 0xFFu ^ previousValue;
                        ++pairCount;
                    }
                }

                for( uint32_t i = 0u; i < pairCount; ++i ) {
                    imageX    = startPos[i];
                    imageXEnd = endPos[i];

                    for( ; imageX != imageXEnd; ++imageX )
                        (*imageX) = value;
                }
            }

            delete[] startPos;
        }

        if( dilationY > 0u ) {
            uint8_t ** startPos = new uint8_t *[2 * height];
            uint8_t ** endPos = startPos + height;

            const uint32_t rowSize = image.rowSize();
            uint8_t * imageX    = image.data() + y * rowSize + x;
            uint8_t * imageXEnd = imageX + width;

            for( ; imageX != imageXEnd; ++imageX ) {
                uint32_t pairCount = 0u;

                uint8_t previousValue = *imageX;

                uint8_t * imageYStart = imageX;
                uint8_t * imageY      = imageYStart + rowSize;
                uint8_t * imageYEnd   = imageYStart + height * rowSize;

                for( ; imageY != imageYEnd; imageY += rowSize ) {
                    if( (*imageY) != previousValue ) {
                        const uint32_t rowId = static_cast<uint32_t>(imageY - imageYStart) / rowSize;

                        if( rowId < dilationY )
                            startPos[pairCount] = imageYStart;
                        else
                            startPos[pairCount] = imageY - dilationY * rowSize;

                        if( height - rowId < dilationY )
                            endPos[pairCount] = imageYEnd;
                        else
                            endPos[pairCount] = imageY + dilationY * rowSize;

                        previousValue = 0xFFu ^ previousValue;
                        ++pairCount;
                    }
                }

                for( uint32_t i = 0u; i < pairCount; ++i ) {
                    imageY    = startPos[i];
                    imageYEnd = endPos[i];

                    for( ; imageY != imageYEnd; imageY += rowSize )
                        (*imageY) = value;
                }
            }

            delete[] startPos;
        }
    }